

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

bool __thiscall
glslang::AccessChainTraverser::visitBinary
          (AccessChainTraverser *this,TVisit param_1,TIntermBinary *binary)

{
  bool bVar1;
  TOperator TVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  TType *this_00;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  undefined4 extraout_var_00;
  TIntermConstantUnion *pTVar6;
  TConstUnionArray *this_02;
  TConstUnion *pTVar7;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TString local_90;
  int local_64;
  TConstUnionArray *pTStack_60;
  int index;
  TConstUnionArray *indices;
  TString memberName;
  TTypeLoc *member;
  TTypeList *members;
  TIntermBinary *binary_local;
  TVisit param_1_local;
  AccessChainTraverser *this_local;
  
  TVar2 = TIntermOperator::getOp(&binary->super_TIntermOperator);
  if (TVar2 == EOpIndexDirectStruct) {
    iVar3 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])();
    this_00 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0xf0))();
    this_01 = &TType::getStruct(this_00)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    iVar3 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])();
    pTVar6 = (TIntermConstantUnion *)
             (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x28))();
    this_02 = TIntermConstantUnion::getConstArray(pTVar6);
    pTVar7 = TConstUnionArray::operator[](this_02,0);
    iVar3 = TConstUnion::getIConst(pTVar7);
    memberName.field_2._8_8_ =
         std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                   (this_01,(long)iVar3);
    iVar3 = (*((const_reference)memberName.field_2._8_8_)->type->_vptr_TType[6])();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 &indices,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_01,iVar3));
    bVar1 = std::operator!=(&this->path,"");
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&this->path,".");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              (&this->path,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &indices);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  &indices);
  }
  TVar2 = TIntermOperator::getOp(&binary->super_TIntermOperator);
  if (TVar2 == EOpIndexDirect) {
    iVar3 = (*(binary->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x33])();
    pTVar6 = (TIntermConstantUnion *)
             (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x28))();
    pTStack_60 = TIntermConstantUnion::getConstArray(pTVar6);
    for (local_64 = 0; iVar3 = local_64, iVar4 = TConstUnionArray::size(pTStack_60), iVar3 < iVar4;
        local_64 = local_64 + 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&this->path,"[");
      pTVar7 = TConstUnionArray::operator[](pTStack_60,(long)local_64);
      uVar5 = TConstUnion::getIConst(pTVar7);
      String_abi_cxx11_(&local_90,(glslang *)(ulong)uVar5,10,iVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&this->path,&local_90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append(&this->path,"]");
    }
  }
  return true;
}

Assistant:

bool visitBinary(TVisit, TIntermBinary* binary) override {
        if (binary->getOp() == EOpIndexDirectStruct)
        {
            const TTypeList& members = *binary->getLeft()->getType().getStruct();
            const TTypeLoc& member =
                members[binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst()];
            TString memberName = member.type->getFieldName();

            if (path != "")
                path.append(".");

            path.append(memberName);
        }

        if (binary->getOp() == EOpIndexDirect)
        {
            const TConstUnionArray& indices = binary->getRight()->getAsConstantUnion()->getConstArray();
            for (int index = 0; index < indices.size(); ++index)
            {
                path.append("[");
                path.append(String(indices[index].getIConst()));
                path.append("]");
            }
        }

        return true;
    }